

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall Lexer::copy_str(Lexer *this,string *dst,int32_t dst_index)

{
  allocator<char> local_61;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40 [36];
  int32_t local_1c;
  string *psStack_18;
  int32_t dst_index_local;
  string *dst_local;
  Lexer *this_local;
  
  local_1c = dst_index;
  psStack_18 = dst;
  dst_local = &this->code_ptr;
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_48 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_50,(long)(this->current_index).index);
  local_60._M_current = (char *)std::__cxx11::string::begin();
  local_58 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_60,(long)local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (local_40,local_48,local_58,&local_61);
  std::__cxx11::string::operator=((string *)psStack_18,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_61);
  (this->current_index).index = local_1c;
  return;
}

Assistant:

void Lexer::copy_str(string &dst, int32_t dst_index) {
//    if (!dst.length())return;
    dst = string(code_ptr.begin() + current_index.index, code_ptr.begin() + dst_index);
    current_index.index = dst_index;
}